

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imd.cpp
# Opt level: O0

bool WriteIMD(FILE *param_1,shared_ptr<Disk> *param_2)

{
  logic_error *this;
  shared_ptr<Disk> *param_1_local;
  FILE *param_0_local;
  
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"IMD writing not implemented");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool WriteIMD(FILE* /*f_*/, std::shared_ptr<Disk>&/*disk*/)
{
    throw std::logic_error("IMD writing not implemented");
#if 0
    time_t now = time(NULL);
    struct tm* tm = localtime(&now);

    // Format a suitable ASCII header
    auto strHeader = util::fmt("IMD SAMdisk%02u%02u%02u, %02u/%02u/%04u %02u:%02u:%02u",
        YEAR % 100, MONTH + 1, DAY, tm->tm_mday, tm->tm_mon + 1,
        1900 + tm->tm_year, tm->tm_hour, tm->tm_min, tm->tm_sec);
    fwrite(strHeader.c_str(), strHeader.length(), 1, f_);

    // Write the comment field, plus a terminating EOF
    fwrite(pd_->strComment.c_str(), pd_->strComment.length(), 1, f_);
    fwrite("\x1a", sizeof(char), 1, f_);


    for (BYTE cyl = 0; cyl < pd_->bUsedCyls; cyl++)
    {
        for (BYTE head = 0; head < pd_->bUsedHeads; head++)
        {
            PCTRACK pt = pd_->PeekTrack(cyl, head);
            int i;

            // Empty tracks aren't included in the image
            if (!pt->sectors)
                continue;

            // Map encrate to IMD track mode
            static BYTE modes[] = { 0, 1, 2, 6, 3, 4, 5, 7 };

            IMD_TRACK it;
            it.mode = modes[(pt->IsMFM() ? 4 : 0) | (pt->encrate & FD_RATE_MASK)];
            it.cyl = cyl;
            it.head = head;
            it.sectors = pt->sectors;
            it.size = pt->sector[0].size;   // default to first sector's size

            BYTE cmap[MAX_SECTORS], hmap[MAX_SECTORS], rmap[MAX_SECTORS], nmap[MAX_SECTORS * 2], hflags = 0;

            // First pass over the sectors to check for oddities
            for (i = 0; i < pt->sectors; i++)
            {
                PCSECTOR ps = &pt->sector[i];

                // Ensure the sector size is legal
                if (ps->size > 7)
                {
                    throw util::exception(CHSR(pt->cyl, pt->head, i, ps->sector), " uses an extended size code, which IMD doesn't support");
                    // ToDo!    ScanTrack(pt, true);
                    return retUnsuitableTarget;
                }
                else if (pt->IsMFM() && ps->IsFM())
                {
                    throw util::exception(CH(pt->cyl, pt->head), " is mixed-density, which IMD doesn't support");
                    // ToDo!    ScanTrack(pt, true);
                    return retUnsuitableTarget;
                }

                // Update the sector, cylinder and head maps
                cmap[i] = ps->cyl;
                hmap[i] = ps->head;
                rmap[i] = ps->sector;
                nmap[i * 2] = SectorSize(ps->size) & 0xff;
                nmap[i * 2 + 1] = static_cast<uint8_t>(SectorSize(ps->size) >> 8);

                // Note deviations from the physical cyl/head values, and fixed sector size
                if (ps->cyl != cyl)   hflags |= 0x80;
                if (ps->head != head) hflags |= 0x40;
                if (ps->size != it.size) it.size = 0xff;
            }

            // Add the flag bits to the track head value
            it.head |= hflags;

            // Write the track header
            if (!fwrite(&it, sizeof(it), 1, f_))
                return retWriteError;

            // Write the sector map
            if (!fwrite(rmap, i, 1, f_))
                return retWriteError;

            // Write the cylinder map if non-standard values were used
            if ((hflags & 0x80) && !fwrite(cmap, i, 1, f_))
                return retWriteError;

            // Write the head map if non-standard values were used
            if ((hflags & 0x40) && !fwrite(hmap, i, 1, f_))
                return retWriteError;

            // Write the size map if mixed sector sizes were used
            if (it.size == 0xff && !fwrite(nmap, 2, i, f_))
                return retWriteError;

            // Second pass over sectors to write the data out
            for (i = 0; i < pt->sectors; i++)
            {
                PCSECTOR ps = &pt->sector[i];
                unsigned uDataSize = SectorSize(ps->size);

                // Check for missing data field
                if (!ps->apbData[0])
                {
                    BYTE bType = 0;

                    // Write the sector data as 'not present'
                    if (!fwrite(&bType, 1, 1, f_))
                        return retWriteError;
                }

                // Sector filled with the same value?
                else if (!memcmp(ps->apbData[0], ps->apbData[0] + 1, uDataSize - 1))
                {
                    BYTE bType = ps->IsDeleted() ? 4 : 2;
                    if (ps->IsDataCRC()) bType += 4;

                    // Write the type and the fill byte to repeat
                    BYTE bFill = ps->apbData[0][0];
                    if (!fwrite(&bType, sizeof(bType), 1, f_) || !fwrite(&bFill, sizeof(bFill), 1, f_))
                        return retWriteError;
                }
                else
                {
                    BYTE bType = ps->IsDeleted() ? 3 : 1;
                    if (ps->IsDataCRC()) bType += 4;

                    // Write the type and the full sector data
                    if (!fwrite(&bType, 1, 1, f_) || !fwrite(ps->apbData[0], uDataSize, 1, f_))
                        return retWriteError;
                }
            }
        }
    }

    return retOK;
#endif
}